

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_SPHERE(effect_handler_context_t *context)

{
  loc_conflict finish;
  _Bool _Var1;
  wchar_t dam_00;
  source origin;
  uint8_t local_30;
  wchar_t local_2c;
  wchar_t flg;
  wchar_t diameter_of_source;
  wchar_t rad;
  wchar_t dam;
  loc_conflict pgrid;
  effect_handler_context_t *context_local;
  
  finish.x = (player->grid).x;
  finish.y = (player->grid).y;
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  if (context->radius == L'\0') {
    local_2c = L'\0';
  }
  else {
    local_2c = context->radius;
  }
  if (context->other == L'\0') {
    local_30 = '\0';
  }
  else {
    local_30 = (uint8_t)context->other;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var1 = project(origin,local_2c,finish,dam_00,context->subtype,L'x',L'\0',local_30,(object *)0x0);
  if (_Var1) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_SPHERE(effect_handler_context_t *context)
{
	struct loc pgrid = player->grid;
	int dam = effect_calculate_value(context, false);
	int rad = context->radius ? context->radius : 0;
	int diameter_of_source = context->other ? context->other : 0;

	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Aim at the target, explode */
	if (project(context->origin, rad, pgrid, dam, context->subtype, flg, 0,
				diameter_of_source, NULL))
		context->ident = true;

	return true;
}